

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlSetTreeDoc(xmlNodePtr tree,xmlDocPtr doc)

{
  xmlDocPtr pxVar1;
  xmlAttrPtr attr;
  _xmlDoc *p_Var2;
  xmlElementType xVar3;
  xmlChar *pxVar4;
  _xmlDict *oldDict;
  _xmlDict *newDict;
  _xmlAttr **pp_Var5;
  _xmlDict *oldDict_00;
  
  if (((tree != (xmlNodePtr)0x0) && (xVar3 = tree->type, xVar3 != XML_NAMESPACE_DECL)) &&
     (pxVar1 = tree->doc, pxVar1 != doc)) {
    if (pxVar1 == (xmlDocPtr)0x0) {
      oldDict_00 = (xmlDictPtr)0x0;
    }
    else {
      oldDict_00 = pxVar1->dict;
    }
    if (doc == (xmlDocPtr)0x0) {
      newDict = (xmlDictPtr)0x0;
    }
    else {
      newDict = doc->dict;
    }
    if (xVar3 == XML_ELEMENT_NODE) {
      pp_Var5 = &tree->properties;
      while (attr = *pp_Var5, attr != (xmlAttrPtr)0x0) {
        if (attr->atype == XML_ATTRIBUTE_ID) {
          xmlRemoveID(tree->doc,attr);
        }
        p_Var2 = attr->doc;
        if (p_Var2 != doc) {
          if (p_Var2 == (_xmlDoc *)0x0) {
            oldDict = (xmlDictPtr)0x0;
          }
          else {
            oldDict = p_Var2->dict;
          }
          pxVar4 = _copyStringForNewDictIfNeeded(oldDict,newDict,attr->name);
          attr->name = pxVar4;
          attr->doc = doc;
        }
        xmlSetListDoc(attr->children,doc);
        pp_Var5 = &attr->next;
      }
      xVar3 = tree->type;
    }
    if (xVar3 == XML_ENTITY_REF_NODE) {
      tree->children = (_xmlNode *)0x0;
    }
    else if (tree->children != (xmlNodePtr)0x0) {
      xmlSetListDoc(tree->children,doc);
    }
    pxVar4 = _copyStringForNewDictIfNeeded(oldDict_00,newDict,tree->name);
    tree->name = pxVar4;
    pxVar4 = _copyStringForNewDictIfNeeded(oldDict_00,(xmlDictPtr)0x0,tree->content);
    tree->content = pxVar4;
    tree->doc = doc;
  }
  return;
}

Assistant:

void
xmlSetTreeDoc(xmlNodePtr tree, xmlDocPtr doc) {
    xmlAttrPtr prop;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return;
    if (tree->doc != doc) {
        xmlDictPtr oldTreeDict = tree->doc ? tree->doc->dict : NULL;
        xmlDictPtr newDict = doc ? doc->dict : NULL;

	if(tree->type == XML_ELEMENT_NODE) {
	    prop = tree->properties;
	    while (prop != NULL) {
                if (prop->atype == XML_ATTRIBUTE_ID) {
                    xmlRemoveID(tree->doc, prop);
                }

                if (prop->doc != doc) {
                    xmlDictPtr oldPropDict = prop->doc ? prop->doc->dict : NULL;
                    prop->name = _copyStringForNewDictIfNeeded(oldPropDict, newDict, prop->name);
                    prop->doc = doc;
                }
		xmlSetListDoc(prop->children, doc);

                /*
                 * TODO: ID attributes should be also added to the new
                 * document, but this breaks things like xmlReplaceNode.
                 * The underlying problem is that xmlRemoveID is only called
                 * if a node is destroyed, not if it's unlinked.
                 */
#if 0
                if (xmlIsID(doc, tree, prop)) {
                    xmlChar *idVal = xmlNodeListGetString(doc, prop->children,
                                                          1);
                    xmlAddID(NULL, doc, idVal, prop);
                }
#endif

		prop = prop->next;
	    }
	}
        if (tree->type == XML_ENTITY_REF_NODE) {
            /*
             * Clear 'children' which points to the entity declaration
             * from the original document.
             */
            tree->children = NULL;
        } else if (tree->children != NULL) {
	    xmlSetListDoc(tree->children, doc);
        }

        tree->name = _copyStringForNewDictIfNeeded(oldTreeDict, newDict, tree->name);
        tree->content = (xmlChar *)_copyStringForNewDictIfNeeded(oldTreeDict, NULL, tree->content);
        /* FIXME: tree->ns should be updated as in xmlStaticCopyNode(). */
	tree->doc = doc;
    }
}